

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
* __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
::move_assign_impl(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
                   *this,vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
                         *rhs)

{
  my_base *pmVar1;
  my_base *pmVar2;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
  *rhs_local;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  pmVar1 = base(this);
  pmVar2 = base(rhs);
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>>
  ::swap_with_propagate<std::integral_constant<bool,false>>
            ((allocator_base<custom::Allocator<unsigned_char,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>>
              *)pmVar1,pmVar2);
  swap_ptrs(this,rhs);
  Catch::clara::std::swap<unsigned_long>(&this->_align_max,&rhs->_align_max);
  return this;
}

Assistant:

inline auto vector<I, A, C>::move_assign_impl(vector&& rhs) noexcept -> vector&
{
    using std::swap;
    base().swap_with_propagate(
        rhs.base(), typename my_base::propagate_on_container_move_assignment {});
    swap_ptrs(std::move(rhs));
    swap(_align_max, rhs._align_max);
    return *this;
}